

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

void __thiscall FIX::Dictionary::Dictionary(Dictionary *this,string *name)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Dictionary = (_func_int **)&PTR__Dictionary_001fc688;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_data)._M_t._M_impl.super__Rb_tree_header;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  return;
}

Assistant:

Dictionary(const std::string &name)
      : m_name(name) {}